

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cms_test.cc
# Opt level: O0

int main(void)

{
  test_batch_create_metrics();
  test_batch_create_sql_metrics();
  test_batch_put_dim_table_data();
  test_batch_query_metric();
  test_create_dim_table();
  test_create_metrics();
  test_create_metric_stream();
  test_create_project();
  test_create_sq_lmetrics();
  test_delete_dim_table();
  test_delete_dim_table_data();
  test_delete_metrics();
  test_delete_metric_stream();
  test_delete_project();
  test_describe_metric();
  test_describe_metric_datum();
  test_describe_metric_list();
  test_get_dim_table();
  test_get_metrics();
  test_get_metrics_meta();
  test_get_metric_statistics();
  test_get_metric_stream();
  test_get_metric_stream_meta();
  test_get_metric_stream_status();
  test_get_project();
  test_get_sq_lmetrics();
  test_list_dim_table();
  test_list_dim_table_data();
  test_list_metrics();
  test_list_metrics_plan();
  test_list_metric_stream();
  test_list_project();
  test_list_sq_lmetrics();
  test_put_dim_table_data();
  test_query_incremental();
  test_query_list_metric();
  test_query_metric();
  test_query_metric_top_n();
  test_query_statistics();
  test_start_metric_stream();
  test_start_project();
  test_status_project();
  test_stop_metric_stream();
  test_stop_project();
  test_update_dim_table();
  test_update_metrics();
  test_update_metric_stream();
  test_update_project();
  test_update_sq_lmetrics();
  return 0;
}

Assistant:

int main() {
  test_batch_create_metrics();
  test_batch_create_sql_metrics();
  test_batch_put_dim_table_data();
  test_batch_query_metric();
  test_create_dim_table();
  test_create_metrics();
  test_create_metric_stream();
  test_create_project();
  test_create_sq_lmetrics();
  test_delete_dim_table();
  test_delete_dim_table_data();
  test_delete_metrics();
  test_delete_metric_stream();
  test_delete_project();
  test_describe_metric();
  test_describe_metric_datum();
  test_describe_metric_list();
  test_get_dim_table();
  test_get_metrics();
  test_get_metrics_meta();
  test_get_metric_statistics();
  test_get_metric_stream();
  test_get_metric_stream_meta();
  test_get_metric_stream_status();
  test_get_project();
  test_get_sq_lmetrics();
  test_list_dim_table();
  test_list_dim_table_data();
  test_list_metrics();
  test_list_metrics_plan();
  test_list_metric_stream();
  test_list_project();
  test_list_sq_lmetrics();
  test_put_dim_table_data();
  test_query_incremental();
  test_query_list_metric();
  test_query_metric();
  test_query_metric_top_n();
  test_query_statistics();
  test_start_metric_stream();
  test_start_project();
  test_status_project();
  test_stop_metric_stream();
  test_stop_project();
  test_update_dim_table();
  test_update_metrics();
  test_update_metric_stream();
  test_update_project();
  test_update_sq_lmetrics();
}